

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O1

void __thiscall QDockAreaLayout::updateSeparatorWidgets(QDockAreaLayout *this)

{
  QList<QWidget_*> *this_00;
  bool bVar1;
  QMainWindowLayout *pQVar2;
  QWidget *separatorWidget;
  pointer ppQVar3;
  ulong uVar4;
  long lVar5;
  int i;
  long lVar6;
  long in_FS_OFFSET;
  undefined1 auVar7 [16];
  QRect QVar8;
  int local_84;
  QRect local_70;
  QRegion local_60;
  QRect local_58;
  undefined4 uStack_48;
  undefined4 local_44;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->separatorWidgets;
  lVar6 = 0;
  local_84 = 0;
  do {
    uVar4 = 0xffffffffffffffff;
    lVar5 = 0;
    do {
      uVar4 = uVar4 + 1;
      if ((ulong)this->docks[lVar6].item_list.d.size <= uVar4) goto LAB_00400862;
      bVar1 = QDockAreaLayoutItem::skip
                        ((QDockAreaLayoutItem *)
                         ((long)&(this->docks[lVar6].item_list.d.ptr)->widgetItem + lVar5));
      lVar5 = lVar5 + 0x28;
    } while (bVar1);
    lVar5 = (long)local_84;
    if (lVar5 < (this->separatorWidgets).d.size) {
      separatorWidget = (this->separatorWidgets).d.ptr[lVar5];
      if (separatorWidget == (QWidget *)0x0) {
        local_58.x1.m_i = 2;
        local_58.y1.m_i = 0;
        local_58.x2.m_i = 0;
        local_58.y2.m_i = 0;
        uStack_48 = 0;
        local_44 = 0;
        local_40 = "default";
        QMessageLogger::warning
                  ((char *)&local_58,
                   "QDockAreaLayout::updateSeparatorWidgets: null separator widget");
        pQVar2 = qt_mainwindow_layout(this->mainWindow);
        separatorWidget = QMainWindowLayout::getSeparatorWidget((QMainWindowLayout *)pQVar2);
        ppQVar3 = QList<QWidget_*>::data(this_00);
        ppQVar3[lVar5] = separatorWidget;
      }
    }
    else {
      pQVar2 = qt_mainwindow_layout(this->mainWindow);
      separatorWidget = QMainWindowLayout::getSeparatorWidget((QMainWindowLayout *)pQVar2);
      local_58.x1.m_i = (int)separatorWidget;
      local_58.y1.m_i = (int)((ulong)separatorWidget >> 0x20);
      QtPrivate::QPodArrayOps<QWidget*>::emplace<QWidget*&>
                ((QPodArrayOps<QWidget*> *)this_00,(this->separatorWidgets).d.size,
                 (QWidget **)&local_58);
      QList<QWidget_*>::end(this_00);
    }
    local_84 = local_84 + 1;
    raiseSeparatorWidget(separatorWidget);
    local_58.x1.m_i = -0x55555556;
    local_58.y1.m_i = -0x55555556;
    local_58.x2.m_i = -0x55555556;
    local_58.y2.m_i = -0x55555556;
    QVar8 = separatorRect(this,(int)lVar6);
    auVar7._12_4_ = QVar8.y2.m_i;
    auVar7._0_4_ = (undefined4)(QVar8._0_8_ + 0xfffffffe);
    auVar7._8_4_ = (undefined4)(QVar8._8_8_ + 2);
    auVar7._4_4_ = auVar7._8_4_;
    local_58._0_8_ = CONCAT44(QVar8.y1.m_i.m_i,auVar7._0_4_) + -0x200000000;
    local_58._8_8_ = auVar7._8_8_ + 0x200000000;
    QWidget::setGeometry(separatorWidget,&local_58);
    QVar8 = separatorRect(this,(int)lVar6);
    local_70.x1.m_i = QVar8.x1.m_i.m_i - local_58.x1.m_i;
    local_70.x2.m_i = QVar8.x2.m_i.m_i - local_58.x1.m_i;
    local_70.y1.m_i = QVar8.y1.m_i.m_i - local_58.y1.m_i;
    local_70.y2.m_i = QVar8.y2.m_i.m_i - local_58.y1.m_i;
    QRegion::QRegion(&local_60,&local_70,Rectangle);
    QWidget::setMask(separatorWidget,&local_60);
    QRegion::~QRegion(&local_60);
    QWidget::show(separatorWidget);
LAB_00400862:
    lVar6 = lVar6 + 1;
    if (lVar6 == 4) {
      for (lVar6 = (long)local_84; lVar6 < (this->separatorWidgets).d.size; lVar6 = lVar6 + 1) {
        QWidget::hide((this->separatorWidgets).d.ptr[lVar6]);
      }
      QList<QWidget_*>::resize(this_00,(long)local_84);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
  } while( true );
}

Assistant:

void QDockAreaLayout::updateSeparatorWidgets() const
{
    int j = 0;

    for (int i = 0; i < QInternal::DockCount; ++i) {
        const QDockAreaLayoutInfo &dock = docks[i];
        if (dock.isEmpty())
            continue;

        QWidget *sepWidget;
        if (j < separatorWidgets.size()) {
            sepWidget = separatorWidgets.at(j);
            if (!sepWidget) {
                qWarning("QDockAreaLayout::updateSeparatorWidgets: null separator widget");
                sepWidget = qt_mainwindow_layout(mainWindow)->getSeparatorWidget();
                separatorWidgets[j] = sepWidget;
            }
        } else {
            sepWidget = qt_mainwindow_layout(mainWindow)->getSeparatorWidget();
            separatorWidgets.append(sepWidget);
        }
        j++;

        Q_ASSERT(sepWidget);
        raiseSeparatorWidget(sepWidget);

        QRect sepRect = separatorRect(i).adjusted(-2, -2, 2, 2);
        sepWidget->setGeometry(sepRect);
        sepWidget->setMask( QRegion(separatorRect(i).translated( - sepRect.topLeft())));
        sepWidget->show();
    }
    for (int i = j; i < separatorWidgets.size(); ++i)
        separatorWidgets.at(i)->hide();

    separatorWidgets.resize(j);
}